

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall
helics::CommonCore::registerDataSink(CommonCore *this,LocalFederateId federateID,string_view name)

{
  InterfaceHandle handle;
  string_view type;
  string_view type_00;
  string_view units;
  undefined1 auVar1 [16];
  ushort flags;
  FederateState *this_00;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var2;
  string_view string1;
  ActionMessage reg;
  
  this_00 = checkNewInterface(this,federateID,name,SINK);
  flags = (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i | 0x4400;
  reg._0_8_ = &reg.dest_id;
  reg.source_id.gid = 0;
  reg.source_handle.hid = 0;
  reg.dest_id.gid._0_1_ = 0;
  type._M_str = "sink";
  type._M_len = 4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = reg._0_8_;
  p_Var2 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,SINK,name,type,
                             (string_view)(auVar1 << 0x40),flags);
  std::__cxx11::string::~string((string *)&reg);
  handle.hid = *(BaseType *)((long)&(p_Var2->super__Hash_node_base)._M_nxt + 4);
  type_00._M_str = "sink";
  type_00._M_len = 4;
  units._M_str = gEmptyString_abi_cxx11_;
  units._M_len = DAT_004b7278;
  FederateState::createInterface(this_00,SINK,handle,name,type_00,units,flags);
  ActionMessage::ActionMessage(&reg,cmd_reg_datasink);
  reg.source_handle.hid = handle.hid;
  reg.source_id.gid = (this_00->global_id)._M_i.gid;
  ActionMessage::name(&reg,name);
  string1._M_str = "sink";
  string1._M_len = 4;
  ActionMessage::setStringData(&reg,string1);
  reg.flags = *(uint16_t *)
               ((long)&(p_Var2->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                       ._M_storage._M_storage + 6);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&reg);
  ActionMessage::~ActionMessage(&reg);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerDataSink(LocalFederateId federateID, std::string_view name)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::SINK);
    const uint16_t sinkFlags =
        fed->getInterfaceFlags() | make_flags(receive_only_flag, targeted_flag);

    const auto& handle = createBasicHandle(
        fed->global_id, fed->local_id, InterfaceType::SINK, name, "sink", std::string{}, sinkFlags);

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::SINK, hid, name, "sink", gEmptyString, sinkFlags);
    ActionMessage reg(CMD_REG_DATASINK);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData("sink");
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}